

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexeme.h
# Opt level: O3

void __thiscall
SGParser::Lexeme::SetLexeme(Lexeme *this,String *name,String *regExpr,uint tokenCode)

{
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->RegularExpression);
  (this->Info).TokenCode = tokenCode;
  (this->Info).Action = 0;
  (this->ActionParam)._M_string_length = 0;
  *(this->ActionParam)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void SetLexeme(const String& name, const String& regExpr, unsigned tokenCode = 0u) {
        Name              = name;
        RegularExpression = regExpr;
        Info              = {tokenCode, LexemeInfo::ActionNone};
        ActionParam.clear();
    }